

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

int sk_reserve(OPENSSL_STACK *st,int n,int exact)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int num_alloc;
  void **tmpdata;
  int local_24;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (0x7fffffff - *in_RDI < in_ESI) {
    local_4 = 0;
  }
  else {
    local_24 = *in_RDI + in_ESI;
    if (local_24 < 4) {
      local_24 = 4;
    }
    if (*(long *)(in_RDI + 2) == 0) {
      pvVar1 = CRYPTO_zalloc((size_t)in_RDI,(char *)CONCAT44(in_ESI,in_EDX),
                             (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
      *(void **)(in_RDI + 2) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        ERR_new();
        ERR_set_debug((char *)in_RDI,in_ESI,in_stack_ffffffffffffffe0);
        ERR_set_error(0xf,0xc0100,(char *)0x0);
        local_4 = 0;
      }
      else {
        in_RDI[5] = local_24;
        local_4 = 1;
      }
    }
    else {
      if (in_EDX == 0) {
        if (local_24 <= in_RDI[5]) {
          return 1;
        }
        local_24 = compute_growth(local_24,in_RDI[5]);
        if (local_24 == 0) {
          return 0;
        }
      }
      else if (local_24 == in_RDI[5]) {
        return 1;
      }
      pvVar1 = CRYPTO_realloc(*(void **)(in_RDI + 2),local_24 << 3,"crypto/stack/stack.c",0xd2);
      if (pvVar1 == (void *)0x0) {
        local_4 = 0;
      }
      else {
        *(void **)(in_RDI + 2) = pvVar1;
        in_RDI[5] = local_24;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int sk_reserve(OPENSSL_STACK *st, int n, int exact)
{
    const void **tmpdata;
    int num_alloc;

    /* Check to see the reservation isn't exceeding the hard limit */
    if (n > max_nodes - st->num)
        return 0;

    /* Figure out the new size */
    num_alloc = st->num + n;
    if (num_alloc < min_nodes)
        num_alloc = min_nodes;

    /* If |st->data| allocation was postponed */
    if (st->data == NULL) {
        /*
         * At this point, |st->num_alloc| and |st->num| are 0;
         * so |num_alloc| value is |n| or |min_nodes| if greater than |n|.
         */
        if ((st->data = OPENSSL_zalloc(sizeof(void *) * num_alloc)) == NULL) {
            ERR_raise(ERR_LIB_CRYPTO, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        st->num_alloc = num_alloc;
        return 1;
    }

    if (!exact) {
        if (num_alloc <= st->num_alloc)
            return 1;
        num_alloc = compute_growth(num_alloc, st->num_alloc);
        if (num_alloc == 0)
            return 0;
    } else if (num_alloc == st->num_alloc) {
        return 1;
    }

    tmpdata = OPENSSL_realloc((void *)st->data, sizeof(void *) * num_alloc);
    if (tmpdata == NULL)
        return 0;

    st->data = tmpdata;
    st->num_alloc = num_alloc;
    return 1;
}